

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL DeleteFileA(LPCSTR lpFileName)

{
  PAL_ERROR PVar1;
  int iVar2;
  size_t sVar3;
  char *_Dst;
  SIZE_T _SizeInBytes;
  long in_FS_OFFSET;
  char *pcStack_90;
  DWORD cchFullUnixFileName;
  LPSTR lpFullUnixFileName;
  int length;
  char *lpUnixFileName;
  BOOL local_70;
  DWORD dwLastError;
  BOOL bRet;
  int result;
  CPalThread *pThread;
  PAL_ERROR palError;
  LPCSTR lpFileName_local;
  PathCharString lpUnixFileNamePS;
  
  lpUnixFileNamePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  local_70 = 0;
  lpUnixFileName._4_4_ = 0;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpFileName_local);
  pcStack_90 = (LPSTR)0x0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  sVar3 = strlen(lpFileName);
  _Dst = StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&lpFileName_local,(long)(int)sVar3);
  if (_Dst != (char *)0x0) {
    _SizeInBytes = StackString<32UL,_char>::GetSizeOf((StackString<32UL,_char> *)&lpFileName_local);
    strcpy_s(_Dst,_SizeInBytes,lpFileName);
    StackString<32UL,_char>::CloseBuffer
              ((StackString<32UL,_char> *)&lpFileName_local,(long)(int)sVar3);
    FILEDosToUnixPathA(_Dst);
    pcStack_90 = (char *)CorUnix::InternalMalloc(0x401);
    if (pcStack_90 == (LPSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      memset(pcStack_90,0,0x401);
      PVar1 = CorUnix::InternalCanonicalizeRealPath(_Dst,pcStack_90,0x401);
      if (PVar1 != 0) {
        CorUnix::InternalFree(pcStack_90);
        pcStack_90 = CorUnix::InternalStrdup(_Dst);
        if (pcStack_90 == (char *)0x0) goto LAB_00395afa;
      }
      iVar2 = unlink(pcStack_90);
      if (iVar2 < 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        lpUnixFileName._4_4_ = FILEGetLastErrorFromErrnoAndFilename(pcStack_90);
      }
      else {
        local_70 = 1;
      }
    }
  }
LAB_00395afa:
  if (lpUnixFileName._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(lpUnixFileName._4_4_);
  }
  if (pcStack_90 != (LPSTR)0x0) {
    CorUnix::InternalFree(pcStack_90);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != lpUnixFileNamePS.m_count) {
      __stack_chk_fail();
    }
    return local_70;
  }
  abort();
}

Assistant:

BOOL
PALAPI
DeleteFileA(
        IN LPCSTR lpFileName)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    int     result;
    BOOL    bRet = FALSE;
    DWORD   dwLastError = 0;
    char * lpUnixFileName;
    int length;
    PathCharString lpUnixFileNamePS;
    LPSTR lpFullUnixFileName = NULL;
    DWORD cchFullUnixFileName = MAX_LONGPATH+1;// InternalCanonicalizeRealPath requires this to be at least PATH_MAX

    PERF_ENTRY(DeleteFileA);
    ENTRY("DeleteFileA(lpFileName=%p (%s))\n", lpFileName?lpFileName:"NULL", lpFileName?lpFileName:"NULL");

    pThread = InternalGetCurrentThread();
    length = strlen(lpFileName);

    lpUnixFileName = lpUnixFileNamePS.OpenStringBuffer(length);
    if (NULL == lpUnixFileName)
    {
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    strcpy_s( lpUnixFileName, lpUnixFileNamePS.GetSizeOf(), lpFileName);
    lpUnixFileNamePS.CloseBuffer(length);
    
    FILEDosToUnixPathA( lpUnixFileName );

    lpFullUnixFileName =  reinterpret_cast<LPSTR>(InternalMalloc(cchFullUnixFileName));
    if ( lpFullUnixFileName == NULL )
    {
        ERROR("InternalMalloc() failed\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    // Initialize the path to zeroes...
    ZeroMemory(lpFullUnixFileName, cchFullUnixFileName);
    
    // Compute the absolute pathname to the file.  This pathname is used
    // to determine if two file names represent the same file.
    palError = InternalCanonicalizeRealPath(lpUnixFileName, lpFullUnixFileName, cchFullUnixFileName);
    if (palError != NO_ERROR)
    {
        InternalFree(lpFullUnixFileName);
        lpFullUnixFileName = InternalStrdup(lpUnixFileName);
        if (!lpFullUnixFileName)
        {
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto done;
        }
    }

    result = unlink( lpFullUnixFileName );

    if (result < 0)
    {
        TRACE("unlink returns %d\n", result);
        dwLastError = FILEGetLastErrorFromErrnoAndFilename(lpFullUnixFileName);
    }
    else
    {
        bRet = TRUE;
    }

done:
    if(dwLastError)
    {
        pThread->SetLastError( dwLastError );
    }
    if (NULL != lpFullUnixFileName)
    {
        InternalFree(lpFullUnixFileName);
    }
    LOGEXIT("DeleteFileA returns BOOL %d\n", bRet);
    PERF_EXIT(DeleteFileA);
    return bRet;
}